

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

int maxdirsterid<btVector3>(btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar9;
  btVector3 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  do {
    iVar1 = maxdirfiltered<btVector3>(p,count,dir,allow);
    if (allow->m_data[iVar1] == 3) {
      return iVar1;
    }
    bVar9 = orth(dir);
    fVar8 = bVar9.m_floats[1];
    fVar5 = (float)*(undefined8 *)(dir->m_floats + 1);
    fVar6 = (float)((ulong)*(undefined8 *)(dir->m_floats + 1) >> 0x20);
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar9.m_floats._8_8_;
    local_58._12_4_ = in_XMM1_Dd;
    local_78 = fVar6 * fVar8 - bVar9.m_floats[2] * fVar5;
    fStack_74 = dir->m_floats[0] * bVar9.m_floats[2] - bVar9.m_floats[0] * fVar6;
    fStack_70 = fVar6 * extraout_XMM0_Dc - bVar9.m_floats[3] * 0.0;
    fStack_6c = fVar6 * extraout_XMM0_Dd - fVar8 * 0.0;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = bVar9.m_floats._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_68 = CONCAT44(fVar6,fVar5 * bVar9.m_floats[0] - fVar8 * dir->m_floats[0]);
    uStack_60 = 0;
    fVar8 = 0.0;
    iVar4 = -1;
    do {
      fVar5 = sinf(fVar8 * 0.017453292);
      fVar6 = cosf(fVar8 * 0.017453292);
      local_88.m_floats[1] =
           (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) +
           (fVar6 * fStack_74 + fVar5 * (float)local_48._4_4_) * 0.025;
      local_88.m_floats[0] =
           (float)*(undefined8 *)dir->m_floats +
           (fVar6 * local_78 + fVar5 * (float)local_48._0_4_) * 0.025;
      local_88.m_floats[2] =
           ((float)local_68 * fVar6 + (float)local_58._0_4_ * fVar5) * 0.025 + dir->m_floats[2];
      local_88.m_floats[3] = 0.0;
      iVar2 = maxdirfiltered<btVector3>(p,count,&local_88,allow);
      if (iVar2 == iVar1 && iVar4 == iVar1) {
LAB_001283df:
        allow->m_data[iVar1] = 3;
        return iVar1;
      }
      fVar5 = fVar8 + -40.0;
      if ((iVar4 != -1) && (iVar4 != iVar2)) {
        for (; fVar5 <= fVar8; fVar5 = fVar5 + 5.0) {
          fVar6 = sinf(fVar5 * 0.017453292);
          fVar7 = cosf(fVar5 * 0.017453292);
          local_88.m_floats[1] =
               (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) +
               (fVar7 * fStack_74 + fVar6 * (float)local_48._4_4_) * 0.025;
          local_88.m_floats[0] =
               (float)*(undefined8 *)dir->m_floats +
               (fVar7 * local_78 + fVar6 * (float)local_48._0_4_) * 0.025;
          local_88.m_floats[2] =
               ((float)local_68 * fVar7 + (float)local_58._0_4_ * fVar6) * 0.025 + dir->m_floats[2];
          local_88.m_floats[3] = 0.0;
          iVar3 = maxdirfiltered<btVector3>(p,count,&local_88,allow);
          if (iVar3 == iVar1 && iVar4 == iVar1) goto LAB_001283df;
          iVar4 = iVar3;
        }
      }
      in_XMM1_Dd = 0;
      in_XMM1_Dc = 0;
      fVar8 = fVar8 + 45.0;
      iVar4 = iVar2;
    } while (fVar8 <= 360.0);
    allow->m_data[iVar1] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = btCross(u,dir);
		int ma=-1;
		for(btScalar x = btScalar(0.0) ; x<= btScalar(360.0) ; x+= btScalar(45.0))
		{
			btScalar s = btSin(SIMD_RADS_PER_DEG*(x));
			btScalar c = btCos(SIMD_RADS_PER_DEG*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(btScalar xx = x-btScalar(40.0) ; xx <= x ; xx+= btScalar(5.0))
				{
					btScalar s = btSin(SIMD_RADS_PER_DEG*(xx));
					btScalar c = btCos(SIMD_RADS_PER_DEG*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	btAssert(0);
	return m;
}